

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorsForTest * Catch::createGeneratorsForTest(void)

{
  GeneratorsForTest *this;
  
  this = (GeneratorsForTest *)operator_new(0x50);
  (this->m_generatorsInOrder).
  super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_generatorsInOrder).
  super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_generatorsByName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_generatorsInOrder).
  super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_generatorsByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->m_generatorsByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)&(this->m_generatorsByName)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_generatorsByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->super_IGeneratorsForTest)._vptr_IGeneratorsForTest = (_func_int **)0x0;
  *(undefined8 *)&(this->m_generatorsByName)._M_t._M_impl = 0;
  GeneratorsForTest::GeneratorsForTest(this);
  return &this->super_IGeneratorsForTest;
}

Assistant:

IGeneratorsForTest* createGeneratorsForTest()
    {
        return new GeneratorsForTest();
    }